

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# client.h
# Opt level: O2

void __thiscall
hedg::Client<hedg::Rest_Client>::
send_request<boost::beast::http::message<true,boost::beast::http::basic_string_body<char,std::char_traits<char>,std::allocator<char>>,boost::beast::http::basic_fields<std::allocator<char>>>,hedg::params::market_catalogue>
          (Client<hedg::Rest_Client> *this,
          _func_void_message<true,_boost::beast::http::basic_string_body<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::beast::http::basic_fields<std::allocator<char>_>_>_ptr_market_catalogue
          *f,market_catalogue *p)

{
  market_catalogue local_140;
  
  if (this->is_connected == false) {
    boost::asio::ssl::
    stream<boost::asio::basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>_>
    ::handshake(&this->sock_,client);
    this->is_connected = true;
  }
  params::market_catalogue::market_catalogue(&local_140,p);
  Rest_Client::
  send<boost::beast::http::message<true,boost::beast::http::basic_string_body<char,std::char_traits<char>,std::allocator<char>>,boost::beast::http::basic_fields<std::allocator<char>>>,hedg::params::market_catalogue>
            ((Rest_Client *)this,f,&local_140);
  params::market_catalogue::~market_catalogue(&local_140);
  return;
}

Assistant:

void send_request(void (*f) (Buff&, T), T p) {

		if (!is_connected) {
			sock_.handshake(ssl_socket::client);
			is_connected = true;
		}
		static_cast<Derived*>(this)->send(f, p);
	}